

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O1

char * __thiscall
QUtf16::convertFromUnicode(QUtf16 *this,char *out,QStringView in,State *state,DataEndianness endian)

{
  int iVar1;
  byte bVar2;
  storage_type_conflict *psVar3;
  QUtf16 *__src;
  undefined2 uVar4;
  
  psVar3 = in.m_data;
  __src = (QUtf16 *)in.m_size;
  if ((psVar3[2] & L'\x01') == L'\0') {
    bVar2 = ((byte)*psVar3 & 4) >> 2;
  }
  else {
    bVar2 = 0;
  }
  iVar1 = 2;
  if ((int)state != 0) {
    iVar1 = (int)state;
  }
  if (bVar2 != 0) {
    uVar4 = 0xfeff;
    if (iVar1 == 1) {
      uVar4 = 0xfffe;
    }
    *(undefined2 *)this = uVar4;
    this = this + 2;
  }
  if (iVar1 == 1) {
    qbswap<2>(__src,(qsizetype)out,this);
  }
  else if (this != __src) {
    memcpy(this,__src,(long)out * 2);
  }
  psVar3[4] = L'\0';
  psVar3[5] = L'\0';
  psVar3[6] = L'\0';
  psVar3[7] = L'\0';
  *(byte *)(psVar3 + 2) = (byte)psVar3[2] | 1;
  return (char *)(this + (long)out * 2);
}

Assistant:

char *QUtf16::convertFromUnicode(char *out, QStringView in, QStringConverter::State *state, DataEndianness endian)
{
    Q_ASSERT(state);
    bool writeBom = !(state->internalState & HeaderDone) && state->flags & QStringConverter::Flag::WriteBom;

    if (endian == DetectEndianness)
        endian = (QSysInfo::ByteOrder == QSysInfo::BigEndian) ? BigEndianness : LittleEndianness;

    if (writeBom) {
        // set them up the BOM
        QChar bom(QChar::ByteOrderMark);
        if (endian == BigEndianness)
            qToBigEndian(bom.unicode(), out);
        else
            qToLittleEndian(bom.unicode(), out);
        out += 2;
    }
    if (endian == BigEndianness)
        qToBigEndian<char16_t>(in.data(), in.size(), out);
    else
        qToLittleEndian<char16_t>(in.data(), in.size(), out);

    state->remainingChars = 0;
    state->internalState |= HeaderDone;
    return out + 2*in.size();
}